

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509write_crt.c
# Opt level: O0

int mbedtls_x509write_crt_pem
              (mbedtls_x509write_cert *crt,uchar *buf,size_t size,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  size_t local_1050;
  size_t olen;
  uchar output_buf [4096];
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  size_t size_local;
  uchar *buf_local;
  mbedtls_x509write_cert *crt_local;
  
  local_1050 = 0;
  crt_local._4_4_ = mbedtls_x509write_crt_der(crt,(uchar *)&olen,0x1000,f_rng,p_rng);
  if ((-1 < crt_local._4_4_) &&
     (crt_local._4_4_ =
           mbedtls_pem_write_buffer
                     ("-----BEGIN CERTIFICATE-----\n","-----END CERTIFICATE-----\n",
                      output_buf + (0xff8 - (long)crt_local._4_4_),(long)crt_local._4_4_,buf,size,
                      &local_1050), crt_local._4_4_ == 0)) {
    crt_local._4_4_ = 0;
  }
  return crt_local._4_4_;
}

Assistant:

int mbedtls_x509write_crt_pem( mbedtls_x509write_cert *crt, unsigned char *buf, size_t size,
                       int (*f_rng)(void *, unsigned char *, size_t),
                       void *p_rng )
{
    int ret;
    unsigned char output_buf[4096];
    size_t olen = 0;

    if( ( ret = mbedtls_x509write_crt_der( crt, output_buf, sizeof(output_buf),
                                   f_rng, p_rng ) ) < 0 )
    {
        return( ret );
    }

    if( ( ret = mbedtls_pem_write_buffer( PEM_BEGIN_CRT, PEM_END_CRT,
                                  output_buf + sizeof(output_buf) - ret,
                                  ret, buf, size, &olen ) ) != 0 )
    {
        return( ret );
    }

    return( 0 );
}